

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O2

STRING_HANDLE encode_url_data(char *text)

{
  uchar charVal;
  byte bVar1;
  size_t sVar2;
  char *memory;
  long lVar3;
  STRING_HANDLE pSVar4;
  LOGGER_LOG p_Var5;
  byte bVar6;
  char cVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  uchar *puVar12;
  ulong __size;
  
  uVar11 = 0xffffffffffffffff;
  puVar12 = (uchar *)text;
  __size = 0;
  do {
    while( true ) {
      charVal = *puVar12;
      puVar12 = puVar12 + 1;
      sVar2 = URL_PrintableCharSize(charVal);
      if (__size < ~sVar2) break;
      __size = uVar11;
      if (charVal == '\0') goto LAB_0017a183;
    }
    __size = __size + sVar2;
  } while (charVal != '\0');
  if ((__size != 0xffffffffffffffff) &&
     (memory = (char *)malloc(__size), uVar11 = __size, memory != (char *)0x0)) {
    lVar3 = 0;
    do {
      bVar1 = *text;
      if (((((ulong)bVar1 < 0x2f) && ((0x670200000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
          ((byte)(bVar1 - 0x30) < 10)) ||
         ((bVar1 == 0x5f || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)))) {
        memory[lVar3] = bVar1;
        lVar8 = 1;
      }
      else {
        bVar6 = bVar1 & 0xf;
        bVar10 = (bVar1 >> 4) - 4;
        if (bVar1 < 0xc0) {
          bVar10 = bVar1 >> 4;
        }
        bVar9 = bVar10 + 0x57;
        if (bVar10 < 10) {
          bVar9 = bVar10 | 0x30;
        }
        cVar7 = bVar6 + 0x57;
        if (bVar6 < 10) {
          cVar7 = bVar6 + 0x30;
        }
        memory[lVar3] = '%';
        if ((char)bVar1 < '\0') {
          memory[lVar3 + 1] = 'c';
          memory[lVar3 + 3] = '%';
          memory[lVar3 + 4] = bVar9;
          memory[lVar3 + 5] = cVar7;
          lVar8 = 6;
          if (bVar1 < 0xc0) {
            memory[lVar3 + 2] = '2';
          }
          else {
            memory[lVar3 + 2] = '3';
          }
        }
        else {
          memory[lVar3 + 1] = bVar9;
          memory[lVar3 + 2] = cVar7;
          lVar8 = 3;
        }
      }
      text = (char *)((byte *)text + 1);
      lVar3 = lVar3 + lVar8;
    } while (bVar1 != 0);
    pSVar4 = STRING_new_with_memory(memory);
    if (pSVar4 == (STRING_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
                  ,"encode_url_data",0x101,1,"URL_Encode:: MALLOC failure on encode.");
      }
      free(memory);
      return (STRING_HANDLE)0x0;
    }
    return pSVar4;
  }
LAB_0017a183:
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 != (LOGGER_LOG)0x0) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
              ,"encode_url_data",0xf2,1,"URL_Encode:: MALLOC failure on encode. size=%zu",uVar11);
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

static STRING_HANDLE encode_url_data(const char* text)
{
    STRING_HANDLE result;
    size_t lengthOfResult = 0;
    char* encodedURL;
    unsigned char currentUnsignedChar;
    const char* iterator = text;

    /*Codes_SRS_URL_ENCODE_06_003: [If input is a zero length string then URL_Encode will return a zero length string.]*/
    do
    {
        currentUnsignedChar = (unsigned char)(*iterator++);
        lengthOfResult = safe_add_size_t(lengthOfResult, URL_PrintableCharSize(currentUnsignedChar));
    } while (currentUnsignedChar != 0);

    if (lengthOfResult == SIZE_MAX ||
        (encodedURL = (char*)malloc(lengthOfResult)) == NULL)
    {
        /*Codes_SRS_URL_ENCODE_06_002: [If an error occurs during the encoding of input then URL_Encode will return NULL.]*/
        result = NULL;
        LogError("URL_Encode:: MALLOC failure on encode. size=%zu", lengthOfResult);
    }
    else
    {
        size_t currentEncodePosition = 0;
        iterator = text;;
        do
        {
            currentUnsignedChar = (unsigned char)(*iterator++);
            currentEncodePosition += URL_PrintableChar(currentUnsignedChar, &encodedURL[currentEncodePosition]);
        } while (currentUnsignedChar != 0);

        result = STRING_new_with_memory(encodedURL);
        if (result == NULL)
        {
            LogError("URL_Encode:: MALLOC failure on encode.");
            free(encodedURL);
        }
    }
    return result;
}